

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O2

void __thiscall
InterpreterTestSuite_IESV_SingleExportFileMustPass_Test::TestBody
          (InterpreterTestSuite_IESV_SingleExportFileMustPass_Test *this)

{
  char *expected_predicate_value;
  char *pcVar1;
  Status local_452;
  allocator local_451;
  allocator local_450;
  allocator local_44f;
  allocator local_44e;
  allocator local_44d;
  allocator local_44c;
  allocator local_44b;
  allocator local_44a;
  Status local_449;
  AssertionResult gtest_ar;
  string local_438;
  Registry *local_418;
  State local_410;
  State local_40c;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_408;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_3e8;
  Expression expr;
  AssertionResult gtest_ar_;
  string local_388;
  string local_368;
  UnixTime local_348;
  UnixTime local_340;
  string local_338;
  string local_318;
  string local_2f8;
  Value value;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  local_418 = ctx.mRegistry;
  std::__cxx11::string::string((string *)&local_438,"127.0.0.1",&local_44a);
  local_3e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&expr,"1.1",&local_44b);
  ot::commissioner::BorderAgent::State::State(&local_40c,0,0,0,0,0);
  std::__cxx11::string::string((string *)&gtest_ar_,"net1",&local_44c);
  std::__cxx11::string::string((string *)&local_368,"",&local_44d);
  std::__cxx11::string::string((string *)&local_388,"",&local_44e);
  std::__cxx11::string::string((string *)&local_2f8,"",&local_44f);
  local_408._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_408._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_408._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_318,"domain1",&local_450);
  pcVar1 = "";
  std::__cxx11::string::string((string *)&local_338,"",&local_451);
  ot::commissioner::UnixTime::UnixTime(&local_340,0);
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)&value,&local_438,0x4e21,(ByteArray *)&local_3e8,(string *)&expr,
             local_40c,(string *)&gtest_ar_,1,&local_368,&local_388,(Timestamp)0x0,0,&local_2f8,
             (ByteArray *)&local_408,&local_318,'\0',0,&local_338,local_340,0x103f);
  local_449 = ot::commissioner::persistent_storage::Registry::Add(local_418,(BorderAgent *)&value);
  local_452 = kSuccess;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            ((internal *)&gtest_ar,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",&local_449,&local_452);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_318);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_408);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&expr);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3e8);
  std::__cxx11::string::~string((string *)&local_438);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&value);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_438,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x255,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_438,(Message *)&value);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
    if (value.mError._0_8_ != 0) {
      (**(code **)(*(long *)value.mError._0_8_ + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    local_418 = ctx.mRegistry;
    std::__cxx11::string::string((string *)&local_438,"127.0.0.2",&local_44a);
    local_3e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&expr,"1.1",&local_44b);
    ot::commissioner::BorderAgent::State::State(&local_410,0,0,0,0,0);
    std::__cxx11::string::string((string *)&gtest_ar_,"net2",&local_44c);
    std::__cxx11::string::string((string *)&local_368,"",&local_44d);
    std::__cxx11::string::string((string *)&local_388,"",&local_44e);
    std::__cxx11::string::string((string *)&local_2f8,"",&local_44f);
    local_408._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_408._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_408._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_318,"domain2",&local_450);
    pcVar1 = "";
    std::__cxx11::string::string((string *)&local_338,"",&local_451);
    ot::commissioner::UnixTime::UnixTime(&local_348,0);
    expected_predicate_value = (char *)(ulong)(uint)local_410;
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&value,&local_438,0x4e21,(ByteArray *)&local_3e8,(string *)&expr,
               local_410,(string *)&gtest_ar_,2,&local_368,&local_388,(Timestamp)0x0,0,&local_2f8,
               (ByteArray *)&local_408,&local_318,'\0',0,&local_338,local_348,0x103f);
    local_449 = ot::commissioner::persistent_storage::Registry::Add(local_418,(BorderAgent *)&value)
    ;
    local_452 = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              ((internal *)&gtest_ar,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
               ,"RegistryStatus::kSuccess",&local_449,&local_452);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_318);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_408);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    std::__cxx11::string::~string((string *)&expr);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_3e8);
    std::__cxx11::string::~string((string *)&local_438);
    if (gtest_ar.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      expr.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string
                ((string *)&value,"br scan --timeout 1 --export ./2.json",(allocator *)&gtest_ar_);
      ot::commissioner::Interpreter::ParseExpression
                ((Expression *)&local_438,&ctx.mInterpreter,(string *)&value);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&expr,&local_438);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_438);
      std::__cxx11::string::~string((string *)&value);
      ot::commissioner::Interpreter::Eval(&value,&ctx.mInterpreter,&expr);
      gtest_ar_.success_ = ot::commissioner::Interpreter::Value::HasNoError(&value);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      if (!gtest_ar_.success_) {
        testing::Message::Message((Message *)&local_368);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_438,(internal *)&gtest_ar_,(AssertionResult *)0x27400f,"false","true",
                   expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_388,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x260,local_438._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_388,(Message *)&local_368)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_388);
        std::__cxx11::string::~string((string *)&local_438);
        if ((long *)local_368._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_368._M_dataplus._M_p + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      ot::commissioner::Interpreter::Value::~Value(&value);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&expr);
      goto LAB_00146a35;
    }
    testing::Message::Message((Message *)&value);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_438,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x25a,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_438,(Message *)&value);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_438);
    if (value.mError._0_8_ != 0) {
      (**(code **)(*(long *)value.mError._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
LAB_00146a35:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, IESV_SingleExportFileMustPass)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    Interpreter::Expression expr;
    expr = ctx.mInterpreter.ParseExpression("br scan --timeout 1 --export ./2.json");

    Interpreter::Value value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}